

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_enc_utils.c
# Opt level: O3

RK_S32 mpi_enc_opt_fps(void *ctx,char *next)

{
  undefined8 *puVar1;
  undefined4 *puVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  undefined4 *puVar5;
  int iVar6;
  undefined8 *puVar7;
  
  if (next == (char *)0x0) {
    _mpp_log_l(2,"mpi_enc_utils","invalid output frame rate\n",0);
    return 0;
  }
  puVar1 = (undefined8 *)((long)ctx + 0x5c);
  puVar2 = (undefined4 *)((long)ctx + 0x60);
  puVar3 = (undefined8 *)((long)ctx + 0x58);
  puVar4 = (undefined8 *)((long)ctx + 0x68);
  puVar5 = (undefined4 *)((long)ctx + 0x6c);
  puVar7 = (undefined8 *)((long)ctx + 100);
  iVar6 = __isoc99_sscanf(next,"%d:%d:%d/%d:%d:%d",puVar1,puVar2,puVar3,puVar4,puVar5,puVar7);
  switch(iVar6 - 1U) {
  case 0:
    *(undefined4 *)puVar4 = *(undefined4 *)puVar1;
    *puVar2 = 1;
    *puVar5 = 1;
    goto LAB_0010978e;
  case 1:
    *puVar4 = *puVar1;
LAB_0010978e:
    *(undefined4 *)puVar3 = 0;
    *(undefined4 *)puVar7 = 0;
    break;
  case 2:
    *puVar5 = *puVar2;
    *puVar7 = *puVar3;
    break;
  case 3:
    *puVar5 = 1;
  case 4:
    *(undefined4 *)puVar7 = 0;
    break;
  case 5:
    break;
  default:
    _mpp_log_l(2,"mpi_enc_utils",
               "invalid in/out frame rate, use \"-fps numerator:denominator:flex\" for set the input to the same fps as the output, such as 50:1:1\n or \"-fps numerator:denominator:flex/numerator:denominator:flex\" for set input and output separately, such as 40:1:1/30:1:0\n"
               ,0);
  }
  return (uint)(iVar6 - 1U < 6);
}

Assistant:

RK_S32 mpi_enc_opt_fps(void *ctx, const char *next)
{
    MpiEncTestArgs *cmd = (MpiEncTestArgs *)ctx;

    if (next) {
        RK_U32 num = sscanf(next, "%d:%d:%d/%d:%d:%d",
                            &cmd->fps_in_num, &cmd->fps_in_den, &cmd->fps_in_flex,
                            &cmd->fps_out_num, &cmd->fps_out_den, &cmd->fps_out_flex);
        switch (num) {
        case 1 : {
            cmd->fps_out_num = cmd->fps_in_num;
            cmd->fps_out_den = cmd->fps_in_den = 1;
            cmd->fps_out_flex = cmd->fps_in_flex = 0;
        } break;
        case 2 : {
            cmd->fps_out_num = cmd->fps_in_num;
            cmd->fps_out_den = cmd->fps_in_den;
            cmd->fps_out_flex = cmd->fps_in_flex = 0;
        } break;
        case 3 : {
            cmd->fps_out_num = cmd->fps_in_num;
            cmd->fps_out_den = cmd->fps_in_den;
            cmd->fps_out_flex = cmd->fps_in_flex;
        } break;
        case 4 : {
            cmd->fps_out_den = 1;
            cmd->fps_out_flex = 0;
        } break;
        case 5 : {
            cmd->fps_out_flex = 0;
        } break;
        case 6 : {
        } break;
        default : {
            mpp_err("invalid in/out frame rate,"
                    " use \"-fps numerator:denominator:flex\""
                    " for set the input to the same fps as the output, such as 50:1:1\n"
                    " or \"-fps numerator:denominator:flex/numerator:denominator:flex\""
                    " for set input and output separately, such as 40:1:1/30:1:0\n");
        } break;
        }

        return (num && num <= 6);
    }

    mpp_err("invalid output frame rate\n");
    return 0;
}